

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::registerCloningFilter
          (CommonCore *this,string_view filterName,string_view type_in,string_view type_out)

{
  string_view name;
  string_view string2;
  string_view string1;
  string_view key;
  string_view type;
  bool bVar1;
  uint16_t uVar2;
  _Elt_pointer in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ActionMessage *in_R8;
  uint uVar3;
  _Elt_pointer in_stack_00000008;
  _Elt_pointer in_stack_00000010;
  InterfaceType in_stack_0000002f;
  CommonCore *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  LocalFederateId in_stack_0000004c;
  ActionMessage reg;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *handle;
  GlobalFederateId fid;
  InterfaceHandle hid;
  _Elt_pointer pAVar4;
  ActionMessage *this_00;
  action_t in_stack_fffffffffffffe3c;
  ActionMessage *in_stack_fffffffffffffe40;
  InterfaceType HandleType;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 uVar5;
  size_t in_stack_fffffffffffffe60;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_01;
  char *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  string_view in_stack_fffffffffffffe90;
  uint16_t in_stack_fffffffffffffea0;
  undefined1 local_150 [240];
  LocalFederateId local_60;
  BaseType local_5c;
  BasicHandleInfo *local_58;
  BaseType local_4c;
  undefined4 local_34;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  uint local_4;
  
  local_34 = 0xfffffefd;
  uVar5 = 0x66;
  local_28[0]._M_len = (size_t)in_RCX;
  local_28[0]._M_str = (char *)in_R8;
  local_28[1]._M_len = in_RSI;
  local_28[1]._M_str = (char *)in_RDX;
  checkNewInterface(in_stack_00000030,in_stack_0000004c,(string_view)in_stack_00000038,
                    in_stack_0000002f);
  local_5c = (BaseType)
             std::atomic<helics::GlobalFederateId>::load
                       ((atomic<helics::GlobalFederateId> *)(in_RDI + 0xaf8),seq_cst);
  HandleType = (InterfaceType)((ulong)in_RDI >> 0x38);
  local_60.fid = 0;
  local_4c = local_5c;
  LocalFederateId::LocalFederateId(&local_60);
  local_150._216_8_ = local_28[1]._M_len;
  local_150._224_8_ = local_28[1]._M_str;
  local_150._200_8_ = local_28[0]._M_len;
  local_150._208_8_ = local_28[0]._M_str;
  local_150._184_8_ = in_stack_00000008;
  local_150._192_8_ = in_stack_00000010;
  uVar2 = make_flags(9);
  uVar3 = (uint)uVar2;
  key._M_str = in_stack_fffffffffffffe68;
  key._M_len = in_stack_fffffffffffffe60;
  type._M_str = in_stack_fffffffffffffe88;
  type._M_len = in_stack_fffffffffffffe80;
  pAVar4 = (_Elt_pointer)local_150._200_8_;
  this_00 = (ActionMessage *)local_150._208_8_;
  local_58 = (BasicHandleInfo *)
             createBasicHandle((CommonCore *)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                               (GlobalFederateId)
                               (BaseType)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                               (LocalFederateId)(BaseType)in_stack_fffffffffffffe70,HandleType,key,
                               type,in_stack_fffffffffffffe90,in_stack_fffffffffffffea0);
  local_4 = (uint)BasicHandleInfo::getInterfaceHandle(local_58);
  this_01 = (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
            local_150;
  ActionMessage::ActionMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  local_150._8_4_ = local_4c;
  local_150._12_4_ = local_4;
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  name._M_str = (char *)this_00;
  name._M_len = (size_t)pAVar4;
  ActionMessage::name((ActionMessage *)0x554a54,name);
  setActionFlag<helics::ActionMessage,helics::FilterFlags>((ActionMessage *)local_150,clone_flag);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
  if ((!bVar1) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008),
     !bVar1)) {
    string1._M_len._4_4_ = in_stack_fffffffffffffe3c;
    string1._M_len._0_4_ = uVar3;
    string1._M_str = (char *)in_stack_fffffffffffffe40;
    string2._M_str = (char *)local_150._192_8_;
    string2._M_len = local_150._184_8_;
    ActionMessage::setStringData(this_00,string1,string2);
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(this_01,(ActionMessage *)CONCAT44(uVar5,in_stack_fffffffffffffe58));
  ActionMessage::~ActionMessage(this_00);
  return (InterfaceHandle)local_4;
}

Assistant:

InterfaceHandle CommonCore::registerCloningFilter(std::string_view filterName,
                                                  std::string_view type_in,
                                                  std::string_view type_out)
{
    checkNewInterface(gLocalCoreId, filterName, InterfaceType::FILTER);
    auto fid = filterFedID.load();

    const auto& handle = createBasicHandle(fid,
                                           LocalFederateId(),
                                           InterfaceType::FILTER,
                                           filterName,
                                           type_in,
                                           type_out,
                                           make_flags(clone_flag));

    auto hid = handle.getInterfaceHandle();

    ActionMessage reg(CMD_REG_FILTER);
    reg.source_id = fid;
    reg.source_handle = hid;
    reg.name(handle.key);
    setActionFlag(reg, clone_flag);
    if ((!type_in.empty()) || (!type_out.empty())) {
        reg.setStringData(type_in, type_out);
    }
    actionQueue.push(std::move(reg));
    return hid;
}